

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O0

void mxx::
     bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,size_t param_3)

{
  size_t sVar1;
  int *piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  bool bVar4;
  int iVar5;
  runtime_error *this;
  unsigned_long local_30;
  size_t np;
  comm *comm_local;
  int *local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  np = param_3;
  local_18 = end._M_current;
  end_local._M_current = begin._M_current;
  local_30 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (begin,end);
  bVar4 = all_same<unsigned_long>(&local_30,(comm *)np);
  if (!bVar4) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"bitonic sort only works for the same number of elements on each process.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::
          is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (end_local._M_current,local_18);
  if (!bVar4) {
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (end_local._M_current,local_18);
  }
  _Var3._M_current = end_local._M_current;
  piVar2 = local_18;
  sVar1 = np;
  iVar5 = comm::size((comm *)np);
  impl::
  bitonic_sort_rec<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (_Var3._M_current,piVar2,sVar1,0,iVar5);
  return;
}

Assistant:

void bitonic_sort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm) {
    size_t np = std::distance(begin, end);
    if (!mxx::all_same(np, comm)) {
        throw std::runtime_error("bitonic sort only works for the same number of elements on each process.");
    }

    if (!std::is_sorted(begin, end, comp)) {
        // sort local elements first
        std::sort(begin, end, comp);
    }

    // recursively sort via bitonic sort
    impl::bitonic_sort_rec(begin, end, comp, comm, 0, comm.size(), impl::asc);
}